

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  tm *ptVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  tm time_struct;
  time_t seconds;
  int local_234;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  tm local_70;
  long local_38;
  string local_30;
  
  local_38 = (long)this / 1000;
  ptVar1 = localtime_r(&local_38,&local_70);
  if (ptVar1 == (tm *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_230);
  }
  else {
    local_234 = local_70.tm_year + 0x76c;
    StreamableToString<int>(&local_30,&local_234);
    std::operator+(&local_170,&local_30,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_190,(String *)(ulong)(local_70.tm_mon + 1),value);
    std::operator+(&local_150,&local_170,&local_190);
    std::operator+(&local_130,&local_150,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_1b0,(String *)(ulong)(uint)local_70.tm_mday,value_00);
    std::operator+(&local_110,&local_130,&local_1b0);
    std::operator+(&local_f0,&local_110,"T");
    String::FormatIntWidth2_abi_cxx11_(&local_1d0,(String *)(ulong)(uint)local_70.tm_hour,value_01);
    std::operator+(&local_d0,&local_f0,&local_1d0);
    std::operator+(&local_b0,&local_d0,":");
    String::FormatIntWidth2_abi_cxx11_(&local_1f0,(String *)(ulong)(uint)local_70.tm_min,value_02);
    std::operator+(&local_90,&local_b0,&local_1f0);
    std::operator+(&local_230,&local_90,":");
    String::FormatIntWidth2_abi_cxx11_(&local_210,(String *)(ulong)(uint)local_70.tm_sec,value_03);
    std::operator+(__return_storage_ptr__,&local_230,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  time_t seconds = static_cast<time_t>(ms / 1000);
  struct tm time_struct;
#ifdef _MSC_VER
  if (localtime_s(&time_struct, &seconds) != 0)
    return "";  // Invalid ms value
#else
  if (localtime_r(&seconds, &time_struct) == NULL)
    return "";  // Invalid ms value
#endif

  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}